

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O2

void * absl::container_internal::Allocate<8ul,std::allocator<char>>(allocator<char> *alloc,size_t n)

{
  uint __line;
  pointer pAVar1;
  char *__assertion;
  A my_mem_alloc;
  
  if (n == 0) {
    __assertion = "n && \"n must be positive\"";
    __line = 0x39;
  }
  else {
    pAVar1 = std::allocator_traits<std::allocator<absl::container_internal::AlignedType<8UL>_>_>::
             allocate(&my_mem_alloc,n + 7 >> 3);
    if (((ulong)pAVar1 & 7) == 0) {
      return pAVar1;
    }
    __assertion = 
    "reinterpret_cast<uintptr_t>(p) % Alignment == 0 && \"allocator does not respect alignment\"";
    __line = 0x43;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/container/internal/container_memory.h"
                ,__line,
                "void *absl::container_internal::Allocate(Alloc *, size_t) [Alignment = 8UL, Alloc = std::allocator<char>]"
               );
}

Assistant:

void* Allocate(Alloc* alloc, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  using M = AlignedType<Alignment>;
  using A = typename absl::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename absl::allocator_traits<Alloc>::template rebind_traits<M>;
  // On macOS, "mem_alloc" is a #define with one argument defined in
  // rpc/types.h, so we can't name the variable "mem_alloc" and initialize it
  // with the "foo(bar)" syntax.
  A my_mem_alloc(*alloc);
  void* p = AT::allocate(my_mem_alloc, (n + sizeof(M) - 1) / sizeof(M));
  assert(reinterpret_cast<uintptr_t>(p) % Alignment == 0 &&
         "allocator does not respect alignment");
  return p;
}